

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionController::TransactionController
          (TransactionController *this,TransactionController *transaction)

{
  string local_30;
  
  AbstractTransactionController::GetHex_abi_cxx11_
            (&local_30,&transaction->super_AbstractTransactionController);
  TransactionController(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

TransactionController::TransactionController(
    const TransactionController& transaction)
    : TransactionController(transaction.GetHex()) {
  // do nothing
}